

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateKotlinDsl
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var3;
  OneofDescriptor *oneof;
  LogMessage *other;
  long *plVar4;
  OneofGeneratorInfo *args_1;
  OneofGeneratorInfo *pOVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  long lVar8;
  string local_88;
  undefined1 *local_68 [2];
  int local_58 [10];
  
  io::Printer::Print<>
            (printer,
             "@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n@com.google.protobuf.kotlin.ProtoDslMarker\n"
            );
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_68,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::Print<char[8],std::__cxx11::string>
            (printer,
             "public class Dsl private constructor(\n  private val _builder: $message$.Builder\n) {\n  public companion object {\n    @kotlin.jvm.JvmSynthetic\n    @kotlin.PublishedApi\n    internal fun _create(builder: $message$.Builder): Dsl = Dsl(builder)\n  }\n\n  @kotlin.jvm.JvmSynthetic\n  @kotlin.PublishedApi\n  internal fun _build(): $message$ = _builder.build()\n"
             ,(char (*) [8])0x420c9a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  if ((int *)local_68[0] != &((LogMessage *)local_68)->line_) {
    operator_delete(local_68[0]);
  }
  io::Printer::Indent(printer);
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 4)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      io::Printer::Print<>(printer,"\n");
      lVar1 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
      if (*(Descriptor **)(lVar1 + 0x20 + lVar8) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_68,
                           "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_68);
      }
      if ((*(byte *)(lVar1 + 1 + lVar8) & 8) == 0) {
        plVar4 = (long *)(*(long *)(lVar1 + 0x20 + lVar8) + 0x28);
      }
      else {
        lVar2 = *(long *)(lVar1 + 0x28 + lVar8);
        if (lVar2 == 0) {
          plVar4 = (long *)(*(long *)(lVar1 + 0x10 + lVar8) + 0x70);
        }
        else {
          plVar4 = (long *)(lVar2 + 0x50);
        }
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
      ._M_head_impl =
           (this->field_generators_).field_generators_.
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(int)((ulong)((lVar1 - *plVar4) + lVar8) >> 3) * 0x38e38e39]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
           ._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                            ._M_head_impl + 0x40))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x48;
    } while (lVar7 < *(int *)((this->super_MessageGenerator).descriptor_ + 4));
  }
  for (p_Var6 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    oneof = *(OneofDescriptor **)(p_Var6 + 1);
    args_1 = Context::GetOneofGeneratorInfo(this->context_,oneof);
    pOVar5 = Context::GetOneofGeneratorInfo(this->context_,oneof);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_88,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    io::Printer::
    Print<char[11],std::__cxx11::string,char[23],std::__cxx11::string,char[8],std::__cxx11::string>
              (printer,
               "public val $oneof_name$Case: $message$.$oneof_capitalized_name$Case\n  @JvmName(\"get$oneof_capitalized_name$Case\")\n  get() = _builder.get$oneof_capitalized_name$Case()\n\npublic fun clear$oneof_capitalized_name$() {\n  _builder.clear$oneof_capitalized_name$()\n}\n"
               ,(char (*) [11])0x3fc475,&args_1->name,(char (*) [23])"oneof_capitalized_name",
               &pOVar5->capitalized_name,(char (*) [8])0x420c9a,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x78)) {
    GenerateKotlinExtensions(this,printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateKotlinDsl(
    io::Printer* printer) const {
  printer->Print(
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "@com.google.protobuf.kotlin.ProtoDslMarker\n");
  printer->Print(
      "public class Dsl private constructor(\n"
      "  private val _builder: $message$.Builder\n"
      ") {\n"
      "  public companion object {\n"
      "    @kotlin.jvm.JvmSynthetic\n"
      "    @kotlin.PublishedApi\n"
      "    internal fun _create(builder: $message$.Builder): Dsl = "
      "Dsl(builder)\n"
      "  }\n"
      "\n"
      "  @kotlin.jvm.JvmSynthetic\n"
      "  @kotlin.PublishedApi\n"
      "  internal fun _build(): $message$ = _builder.build()\n",
      "message", name_resolver_->GetClassName(descriptor_, true));

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateKotlinDslMembers(printer);
  }

  for (auto oneof : oneofs_) {
    printer->Print(
        "public val $oneof_name$Case: $message$.$oneof_capitalized_name$Case\n"
        "  @JvmName(\"get$oneof_capitalized_name$Case\")\n"
        "  get() = _builder.get$oneof_capitalized_name$Case()\n\n"
        "public fun clear$oneof_capitalized_name$() {\n"
        "  _builder.clear$oneof_capitalized_name$()\n"
        "}\n",
        "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name,
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name, "message",
        name_resolver_->GetClassName(descriptor_, true));
  }

  if (descriptor_->extension_range_count() > 0) {
    GenerateKotlinExtensions(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
}